

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O1

void __thiscall
entt::basic_sparse_set<entt::entity,_std::allocator<entt::entity>_>::in_place_pop
          (basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *this,entity entt)

{
  entity eVar1;
  pointer peVar2;
  entity *peVar3;
  entity eVar4;
  
  peVar3 = sparse_ref(this,entt);
  eVar4 = *peVar3 & 0xfffff;
  peVar2 = (this->packed).super__Vector_base<entt::entity,_std::allocator<entt::entity>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (peVar2[eVar4] == entt) {
    eVar1 = this->free_list;
    this->free_list = *peVar3 | 0xfff00000;
    peVar2[eVar4] = eVar1;
    *peVar3 = 0xffffffff;
    return;
  }
  __assert_fail("packed[pos] == entt",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/entt/./single_include/entt/entt.hpp"
                ,0x32f9,
                "virtual void entt::basic_sparse_set<entt::entity>::in_place_pop(const Entity) [Entity = entt::entity]"
               );
}

Assistant:

virtual void in_place_pop(const Entity entt) {
        auto &ref = sparse_ref(entt);
        const auto pos = static_cast<size_type>(entity_traits::to_entity(ref));
        ENTT_ASSERT(packed[pos] == entt, "Invalid identifier");

        packed[pos] = std::exchange(free_list, entity_traits::combine(static_cast<typename entity_traits::entity_type>(pos), entity_traits::reserved));
        // lazy self-assignment guard
        ref = null;
    }